

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnv.hpp
# Opt level: O1

uint64_t __thiscall
pstore::fnv_64a_hash::operator()(fnv_64a_hash *this,sstring_view<const_char_*> *c)

{
  char *pcVar1;
  long lVar2;
  uint64_t uVar3;
  extent_type<_1L> local_28 [2];
  
  uVar3 = 0xcbf29ce484222325;
  pcVar1 = c->ptr_;
  gsl::details::extent_type<-1L>::extent_type(local_28,c->size_);
  if (local_28[0].size_ == 0) {
    uVar3 = 0xcbf29ce484222325;
  }
  else {
    lVar2 = 0;
    do {
      uVar3 = ((byte)pcVar1[lVar2] ^ uVar3) * 0x100000001b3;
      lVar2 = lVar2 + 1;
    } while (local_28[0].size_ != lVar2);
  }
  return uVar3;
}

Assistant:

std::uint64_t operator() (Container const & c) const {
            return fnv_64a_buf (gsl::make_span (c));
        }